

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool anyFeatureDescriptionOfDescription<CoreML::Specification::ModelDescription>
               (ModelDescription *description,
               function<bool_(const_CoreML::Specification::FeatureDescription_&)> *criteria)

{
  uint32_t uVar1;
  Rep *pRVar2;
  bool bVar3;
  undefined1 *puVar4;
  long lVar5;
  FeatureDescription *pFVar6;
  long lVar7;
  void **ppvVar8;
  bool bVar9;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar7 = (long)(description->input_).super_RepeatedPtrFieldBase.current_size_;
  bVar9 = lVar7 == 0;
  pFVar6 = (FeatureDescription *)criteria;
  if (!bVar9) {
    lVar5 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002f3466;
      pFVar6 = *(FeatureDescription **)((long)ppvVar8 + lVar5);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar6);
      if (bVar3) {
        if (!bVar9) {
          return true;
        }
        break;
      }
      lVar5 = lVar5 + 8;
      bVar9 = lVar7 * 8 == lVar5;
    } while (!bVar9);
  }
  pRVar2 = (description->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar7 = (long)(description->output_).super_RepeatedPtrFieldBase.current_size_;
  bVar9 = lVar7 == 0;
  if (!bVar9) {
    lVar5 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002f3466;
      pFVar6 = *(FeatureDescription **)((long)ppvVar8 + lVar5);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar6);
      if (bVar3) {
        if (!bVar9) {
          return true;
        }
        break;
      }
      lVar5 = lVar5 + 8;
      bVar9 = lVar7 * 8 == lVar5;
    } while (!bVar9);
  }
  pRVar2 = (description->state_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar7 = (long)(description->state_).super_RepeatedPtrFieldBase.current_size_;
  bVar9 = lVar7 != 0;
  if (bVar9) {
    lVar5 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_002f3466:
        std::__throw_bad_function_call();
        puVar4 = (undefined1 *)pFVar6->type_;
        if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
          puVar4 = CoreML::Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar4)->_oneof_case_[0] == 4) {
          uVar1 = ((((FeatureType *)puVar4)->Type_).imagetype_)->_oneof_case_[0];
        }
        else {
          if (((FeatureType *)puVar4)->_oneof_case_[0] != 5) {
            return false;
          }
          uVar1 = ((((FeatureType *)puVar4)->Type_).multiarraytype_)->_oneof_case_[0];
        }
        if (uVar1 == 0) {
          return false;
        }
        return true;
      }
      pFVar6 = *(FeatureDescription **)((long)ppvVar8 + lVar5);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar6);
      if (bVar3) {
        return bVar9;
      }
      lVar5 = lVar5 + 8;
      bVar9 = lVar7 * 8 != lVar5;
    } while (bVar9);
  }
  return bVar9;
}

Assistant:

static bool anyFeatureDescriptionOfDescription(const Description &description,
                                               std::function<bool(const Specification::FeatureDescription& fd)> criteria) {
    for (const auto& fd: description.input()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.output()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.state()) {
        if (criteria(fd)) {
            return true;
        }
    }
    return false;
}